

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O3

SQInteger __thiscall SQBlob::Read(SQBlob *this,void *buffer,SQInteger size)

{
  long lVar1;
  long lVar2;
  
  lVar1 = this->_size;
  lVar2 = this->_ptr;
  if ((lVar1 < size + lVar2) && (size = lVar1 - lVar2, size == 0 || lVar1 < lVar2)) {
    size = 0;
  }
  else {
    memcpy(buffer,this->_buf + lVar2,size);
    this->_ptr = this->_ptr + size;
  }
  return size;
}

Assistant:

SQInteger Read(void *buffer,SQInteger size) {
        SQInteger n = size;
        if(!CanAdvance(size)) {
            if((_size - _ptr) > 0)
                n = _size - _ptr;
            else return 0;
        }
        memcpy(buffer, &_buf[_ptr], n);
        _ptr += n;
        return n;
    }